

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

int ED::LongestChain(Chain *chains,int root)

{
  int local_28;
  int local_24;
  int max;
  int len1;
  int len0;
  int root_local;
  Chain *chains_local;
  
  if ((root == -1) || (chains[root].len == 0)) {
    chains_local._4_4_ = 0;
  }
  else {
    max = 0;
    if (chains[root].children[0] != -1) {
      max = LongestChain(chains,chains[root].children[0]);
    }
    local_24 = 0;
    if (chains[root].children[1] != -1) {
      local_24 = LongestChain(chains,chains[root].children[1]);
    }
    if (max < local_24) {
      local_28 = local_24;
      chains[root].children[0] = -1;
    }
    else {
      local_28 = max;
      chains[root].children[1] = -1;
    }
    chains_local._4_4_ = chains[root].len + local_28;
  }
  return chains_local._4_4_;
}

Assistant:

int ED::LongestChain(Chain *chains, int root) {
	if (root == -1 || chains[root].len == 0) return 0;

	int len0 = 0;
	if (chains[root].children[0] != -1) len0 = LongestChain(chains, chains[root].children[0]);

	int len1 = 0;
	if (chains[root].children[1] != -1) len1 = LongestChain(chains, chains[root].children[1]);

	int max = 0;

	if (len0 >= len1) {
		max = len0;
		chains[root].children[1] = -1;

	}
	else {
		max = len1;
		chains[root].children[0] = -1;
	} //end-else

	return chains[root].len + max;
}